

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_server_auth.cc
# Opt level: O0

int main(void)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  Builder<prometheus::Counter> *pBVar1;
  element_type *registry_00;
  Family<prometheus::Counter> *this;
  Counter *pCVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_350;
  int local_2fc;
  duration<long,_std::ratio<1L,_1L>_> local_2f8;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  anon_class_1_0_00000001 local_299;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_298;
  allocator local_271;
  string local_270;
  weak_ptr<prometheus::Collectable> local_250;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_23a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_239;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  iterator local_1b0;
  size_type local_1a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  Counter *local_170;
  Counter *seconds_counter;
  string local_160;
  allocator local_139;
  string local_138;
  Builder<prometheus::Counter> local_118;
  Family<prometheus::Counter> *local_a8;
  Family<prometheus::Counter> *counter_family;
  shared_ptr<prometheus::Registry> registry;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  Exposer exposer;
  
  exposer.mutex_.super___mutex_base._M_mutex._36_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"127.0.0.1:8080",&local_79);
  prometheus::Exposer::Exposer((Exposer *)local_58,&local_78,1,(CivetCallbacks *)0x0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::make_shared<prometheus::Registry>();
  prometheus::BuildCounter();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"time_running_seconds_total",&local_139);
  pBVar1 = prometheus::detail::Builder<prometheus::Counter>::Name(&local_118,&local_138);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_160,"How many seconds is this server running?",
             (allocator *)((long)&seconds_counter + 7));
  pBVar1 = prometheus::detail::Builder<prometheus::Counter>::Help(pBVar1,&local_160);
  registry_00 = std::
                __shared_ptr_access<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&counter_family);
  this = prometheus::detail::Builder<prometheus::Counter>::Register(pBVar1,registry_00);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)((long)&seconds_counter + 7));
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  prometheus::detail::Builder<prometheus::Counter>::~Builder(&local_118);
  local_238 = &local_230;
  local_a8 = this;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[4],_true>
            (local_238,(char (*) [14])0x16b087,(char (*) [4])"bar");
  local_238 = &local_1f0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[4],_true>
            (local_238,(char (*) [18])"yet_another_label",(char (*) [4])"baz");
  local_1b0 = &local_230;
  local_1a8 = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_23a);
  __l._M_len = local_1a8;
  __l._M_array = local_1b0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_1a0,__l,&local_239,&local_23a);
  pCVar2 = prometheus::Family<prometheus::Counter>::Add<>(this,&local_1a0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_1a0);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_23a);
  local_350 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1b0;
  do {
    local_350 = local_350 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_350);
  } while (local_350 != &local_230);
  local_170 = pCVar2;
  std::weak_ptr<prometheus::Collectable>::weak_ptr<prometheus::Registry,void>
            (&local_250,(shared_ptr<prometheus::Registry> *)&counter_family);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"/metrics",&local_271);
  prometheus::Exposer::RegisterCollectable((Exposer *)local_58,&local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::weak_ptr<prometheus::Collectable>::~weak_ptr(&local_250);
  std::function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)>::
  function<main::__0,void>
            ((function<bool(std::__cxx11::string_const&,std::__cxx11::string_const&)> *)&local_298,
             &local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,"Some Auth Realm",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e8,"/metrics",&local_2e9);
  prometheus::Exposer::RegisterAuth((Exposer *)local_58,&local_298,&local_2c0,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_298);
  do {
    local_2fc = 1;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_2f8,&local_2fc);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_2f8);
    prometheus::Counter::Increment(local_170,1.0);
  } while( true );
}

Assistant:

int main() {
  using namespace prometheus;

  // create an http server running on port 8080
  Exposer exposer{"127.0.0.1:8080", 1};

  auto registry = std::make_shared<Registry>();

  // add a new counter family to the registry (families combine values with the
  // same name, but distinct label dimensions)
  auto& counter_family = BuildCounter()
                             .Name("time_running_seconds_total")
                             .Help("How many seconds is this server running?")
                             .Register(*registry);

  // add a counter to the metric family
  auto& seconds_counter = counter_family.Add(
      {{"another_label", "bar"}, {"yet_another_label", "baz"}});

  // ask the exposer to scrape registry on incoming scrapes for "/metrics"
  exposer.RegisterCollectable(registry, "/metrics");
  exposer.RegisterAuth(
      [](const std::string& user, const std::string& password) {
        return user == "test_user" && password == "test_password";
      },
      "Some Auth Realm");

  for (;;) {
    std::this_thread::sleep_for(std::chrono::seconds(1));
    // increment the counters by one (second)
    seconds_counter.Increment(1.0);
  }
  return 0;
}